

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O1

Expr * __thiscall SQCompilation::SQParser::parseStringTemplate(SQParser *this)

{
  Arena *this_00;
  uint uVar1;
  Expr **ppEVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  Expr *pEVar5;
  CallExpr *this_01;
  Chunk *pCVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  SQUnsignedInteger size;
  sqvector<char,_unsigned_int> formatString;
  sqvector<SQCompilation::Expr_*,_unsigned_int> args;
  char buffer [64];
  sqvector<char,_unsigned_int> local_c8;
  sqvector<SQCompilation::Expr_*,_unsigned_int> local_b0;
  SQInteger local_98;
  SQInteger local_90;
  SQInteger local_88;
  SQInteger local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  (this->_lex)._state = LS_TEMPALTE;
  (this->_lex)._expectedToken = 0x151;
  local_80 = (this->_lex)._tokencolumn;
  local_88 = (this->_lex)._tokenline;
  Lex(this);
  local_c8._alloc_ctx = this->_ctx->_vm->_sharedstate->_alloc_ctx;
  this_01 = (CallExpr *)0x0;
  local_c8._vals = (SQChar *)0x0;
  local_c8._size = 0;
  local_c8._allocated = 0;
  local_b0._alloc_ctx = this->_ctx->_vm->_sharedstate->_alloc_ctx;
  local_b0._vals = (Expr **)0x0;
  local_b0._size = 0;
  local_b0._allocated = 0;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_90 = (this->_lex)._tokencolumn;
  local_98 = (this->_lex)._tokenline;
  uVar8 = 0;
  while (lVar9 = this->_token, lVar9 != 0) {
    if (lVar9 - 0x154U < 0xfffffffffffffffd) {
      this_01 = (CallExpr *)0x0;
      reportDiagnostic(this,0x19,"STRING_LITERAL");
      goto LAB_00165319;
    }
    appendStringData(&local_c8,(this->_lex)._svalue);
    if (lVar9 == 0x153) break;
    snprintf(local_78,0x40,"%d",uVar8);
    appendStringData(&local_c8,local_78);
    (this->_lex)._expectedToken = -1;
    (this->_lex)._state = LS_REGULAR;
    Lex(this);
    pEVar5 = Expression(this,SQE_FUNCTION_ARG);
    if (local_b0._allocated <= local_b0._size) {
      uVar1 = local_b0._size * 2;
      if (local_b0._size * 2 == 0) {
        uVar1 = 4;
      }
      local_b0._vals =
           (Expr **)sq_vm_realloc(local_b0._alloc_ctx,local_b0._vals,(ulong)local_b0._allocated << 3
                                  ,(ulong)uVar1 * 8);
      local_b0._allocated = uVar1;
    }
    uVar7 = local_b0._16_8_ & 0xffffffff;
    local_b0._size = local_b0._size + 1;
    local_b0._vals[uVar7] = pEVar5;
    lVar9 = this->_token;
    if (lVar9 == 0x7d) {
      if (local_c8._allocated <= local_c8._size) {
        uVar1 = local_c8._size * 2;
        if (local_c8._size * 2 == 0) {
          uVar1 = 4;
        }
        local_c8._vals =
             (char *)sq_vm_realloc(local_c8._alloc_ctx,local_c8._vals,(ulong)local_c8._allocated,
                                   (ulong)uVar1);
        local_c8._allocated = uVar1;
      }
      uVar7 = local_c8._16_8_ & 0xffffffff;
      local_c8._size = local_c8._size + 1;
      local_c8._vals[uVar7] = '}';
      (this->_lex)._state = LS_TEMPALTE;
      (this->_lex)._expectedToken = 0x152;
    }
    else {
      reportDiagnostic(this,0x19,"}");
    }
    if (lVar9 != 0x7d) goto LAB_00165319;
    uVar8 = (ulong)((int)uVar8 + 1);
    Lex(this);
  }
  SVar4 = local_80;
  SVar3 = local_88;
  if (local_c8._allocated <= local_c8._size) {
    size = 4;
    if (local_c8._size * 2 != 0) {
      size = (SQUnsignedInteger)(local_c8._size * 2);
    }
    local_c8._vals =
         (char *)sq_vm_realloc(local_c8._alloc_ctx,local_c8._vals,(ulong)local_c8._allocated,size);
    local_c8._allocated = (int)size;
  }
  uVar8 = local_c8._16_8_ & 0xffffffff;
  local_c8._size = local_c8._size + 1;
  local_c8._vals[uVar8] = '\0';
  this_01 = (CallExpr *)newStringLiteral(this,local_c8._vals);
  (this_01->super_Expr).super_Node._coordinates.lineStart = (int)local_98;
  (this_01->super_Expr).super_Node._coordinates.columnStart = (int)local_90;
  (this_01->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
  (this_01->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
  if (local_b0._size != 0) {
    pCVar6 = Arena::findChunk(this->_astArena,0x40);
    pEVar5 = (Expr *)pCVar6->_ptr;
    pCVar6->_ptr = (uint8_t *)(pEVar5 + 2);
    (pEVar5->super_Node)._op = TO_GETFIELD;
    (pEVar5->super_Node)._coordinates.lineStart = -1;
    (pEVar5->super_Node)._coordinates.columnStart = -1;
    (pEVar5->super_Node)._coordinates.lineEnd = -1;
    (pEVar5->super_Node)._coordinates.columnEnd = -1;
    pEVar5[1].super_Node.super_ArenaObj._vptr_ArenaObj = (_func_int **)this_01;
    *(undefined1 *)&pEVar5[1].super_Node._coordinates.lineStart = 0;
    *(char **)&pEVar5[1].super_Node._coordinates.lineEnd = "subst";
    (pEVar5->super_Node).super_ArenaObj._vptr_ArenaObj = (_func_int **)&PTR__ArenaObj_001a4bb8;
    *(undefined1 *)&pEVar5[1].super_Node._op = TO_IF;
    (pEVar5->super_Node)._coordinates.lineStart = (int)SVar3;
    (pEVar5->super_Node)._coordinates.columnStart = (int)SVar4;
    (pEVar5->super_Node)._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (pEVar5->super_Node)._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    this_00 = this->_astArena;
    pCVar6 = Arena::findChunk(this_00,0x48);
    ppEVar2 = local_b0._vals;
    this_01 = (CallExpr *)pCVar6->_ptr;
    pCVar6->_ptr = (uint8_t *)(this_01 + 1);
    (this_01->super_Expr).super_Node._op = TO_CALL;
    (this_01->super_Expr).super_Node._coordinates.lineStart = -1;
    (this_01->super_Expr).super_Node._coordinates.columnStart = -1;
    (this_01->super_Expr).super_Node._coordinates.lineEnd = -1;
    (this_01->super_Expr).super_Node._coordinates.columnEnd = -1;
    (this_01->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a4b80;
    this_01->_callee = pEVar5;
    (this_01->_args)._arena = this_00;
    (this_01->_args)._vals = (Expr **)0x0;
    (this_01->_args)._size = 0;
    (this_01->_args)._allocated = 0;
    this_01->_nullable = false;
    (this_01->super_Expr).super_Node._coordinates.lineStart = (int)SVar3;
    (this_01->super_Expr).super_Node._coordinates.columnStart = (int)SVar4;
    (this_01->super_Expr).super_Node._coordinates.lineEnd = (int)(this->_lex)._currentline;
    (this_01->super_Expr).super_Node._coordinates.columnEnd = (int)(this->_lex)._currentcolumn;
    uVar8 = local_b0._16_8_ & 0xffffffff;
    if (uVar8 != 0) {
      lVar9 = 0;
      do {
        CallExpr::addArgument(this_01,*(Expr **)((long)ppEVar2 + lVar9));
        lVar9 = lVar9 + 8;
      } while (uVar8 << 3 != lVar9);
    }
  }
  (this->_lex)._expectedToken = -1;
  (this->_lex)._state = LS_REGULAR;
  Lex(this);
LAB_00165319:
  sqvector<SQCompilation::Expr_*,_unsigned_int>::~sqvector(&local_b0);
  sqvector<char,_unsigned_int>::~sqvector(&local_c8);
  return &this_01->super_Expr;
}

Assistant:

Expr *SQParser::parseStringTemplate() {

    // '$' TK_TEMPLATE_PREFIX? (arg TK_TEMPLATE_INFIX)* arg? TK_TEMPLATE_SUFFX

    _lex._state = LS_TEMPALTE;
    _lex._expectedToken = TK_TEMPLATE_PREFIX;

    SQInteger l = line(), c = column();

    Lex();
    int idx = 0;

    sqvector<SQChar> formatString(_ctx.allocContext());
    sqvector<Expr *> args(_ctx.allocContext());
    char buffer[64] = {0};

    SQInteger fmtL = line(), fmtC = column();
    SQInteger tok = -1;

    while ((tok = _token) != SQUIRREL_EOB) {

      if (tok != TK_TEMPLATE_PREFIX && tok != TK_TEMPLATE_INFIX && tok != TK_TEMPLATE_SUFFIX) {
          reportDiagnostic(DiagnosticsId::DI_EXPECTED_TOKEN, _SC("STRING_LITERAL"));
          return nullptr;
      }

      appendStringData(formatString, _lex._svalue);
      if (tok != TK_TEMPLATE_SUFFIX) {
        snprintf(buffer, sizeof buffer, "%d", idx++);
        appendStringData(formatString, buffer);
        _lex._expectedToken = -1;
        _lex._state = LS_REGULAR;
        Lex();
        Expr *arg = Expression(SQE_FUNCTION_ARG);
        args.push_back(arg);

        if (_token != _SC('}')) {
            reportDiagnostic(DiagnosticsId::DI_EXPECTED_TOKEN, _SC("}"));
            return nullptr;
        }

        formatString.push_back(_SC('}'));

        _lex._state = LS_TEMPALTE;
        _lex._expectedToken = TK_TEMPLATE_INFIX;
      }
      else {
        break;
      }
      Lex();
    }

    formatString.push_back('\0');

    Expr *result = nullptr;
    LiteralExpr *fmt = setCoordinates(newStringLiteral(&formatString[0]), fmtL, fmtC);

    if (args.empty()) {
      result = fmt;
    }
    else {
      Expr *callee = setCoordinates(newNode<GetFieldExpr>(fmt, "subst", false, /* force type method */ true), l, c);
      CallExpr *call = setCoordinates(newNode<CallExpr>(arena(), callee, false), l, c);

      for (Expr *arg : args)
        call->addArgument(arg);

      result = call;
    }

    _lex._expectedToken = -1;
    _lex._state = LS_REGULAR;
    Lex();

    return result;
}